

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyFixLanguageInformation(TidyDocImpl *doc,Node *node,Bool wantXmlLang,Bool wantLang)

{
  Node *pNVar1;
  Bool BVar2;
  uint uVar3;
  AttVal *attr;
  AttVal *attr_00;
  
  if (node != (Node *)0x0) {
    do {
      pNVar1 = node->next;
      BVar2 = prvTidynodeIsElement(node);
      if (BVar2 != no) {
        attr = prvTidyAttrGetById(node,TidyAttr_LANG);
        attr_00 = prvTidyAttrGetById(node,TidyAttr_XML_LANG);
        if (attr == (AttVal *)0x0 || attr_00 == (AttVal *)0x0) {
          if (wantXmlLang != no && attr != (AttVal *)0x0) {
            uVar3 = prvTidyNodeAttributeVersions(node,TidyAttr_XML_LANG);
            if ((doc->lexer->versionEmitted & uVar3) != 0) {
              prvTidyRepairAttrValue(doc,node,"xml:lang",attr->value);
            }
            goto LAB_00151534;
          }
          if (wantLang == no || attr_00 == (AttVal *)0x0) goto LAB_00151534;
          uVar3 = prvTidyNodeAttributeVersions(node,TidyAttr_LANG);
          if ((doc->lexer->versionEmitted & uVar3) != 0) {
            prvTidyRepairAttrValue(doc,node,"lang",attr_00->value);
          }
        }
        else {
LAB_00151534:
          if (attr != (AttVal *)0x0 && wantLang == no) {
            prvTidyRemoveAttribute(doc,node,attr);
          }
        }
        if (attr_00 != (AttVal *)0x0 && wantXmlLang == no) {
          prvTidyRemoveAttribute(doc,node,attr_00);
        }
      }
      if (node->content != (Node *)0x0) {
        prvTidyFixLanguageInformation(doc,node->content,wantXmlLang,wantLang);
      }
      node = pNVar1;
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(FixLanguageInformation)(TidyDocImpl* doc, Node* node, Bool wantXmlLang, Bool wantLang)
{
    Node* next;

    while (node)
    {
        next = node->next;

        /* todo: report modifications made here to the report system */

        if (TY_(nodeIsElement)(node))
        {
            AttVal* lang = TY_(AttrGetById)(node, TidyAttr_LANG);
            AttVal* xmlLang = TY_(AttrGetById)(node, TidyAttr_XML_LANG);

            if (lang && xmlLang)
            {
                /*
                  todo: check whether both attributes are in sync,
                  here or elsewhere, where elsewhere is probably
                  preferable.
                  AD - March 2005: not mandatory according the standards.
                */
            }
            else if (lang && wantXmlLang)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_XML_LANG )
                    & doc->lexer->versionEmitted)
                    TY_(RepairAttrValue)(doc, node, "xml:lang", lang->value);
            }
            else if (xmlLang && wantLang)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_LANG )
                    & doc->lexer->versionEmitted)
                    TY_(RepairAttrValue)(doc, node, "lang", xmlLang->value);
            }

            if (lang && !wantLang)
                TY_(RemoveAttribute)(doc, node, lang);
            
            if (xmlLang && !wantXmlLang)
                TY_(RemoveAttribute)(doc, node, xmlLang);
        }

        if (node->content)
            TY_(FixLanguageInformation)(doc, node->content, wantXmlLang, wantLang);

        node = next;
    }
}